

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  const_reference pvVar5;
  code *in_RDI;
  bool bVar6;
  Image output;
  uint8_t channelId;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  byte value;
  undefined2 uVar7;
  uint8_t in_stack_ffffffffffffff46;
  undefined1 uVar8;
  uint8_t in_stack_ffffffffffffff47;
  undefined1 uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar11;
  undefined1 local_a8 [7];
  uint8_t in_stack_ffffffffffffff5f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  Image *in_stack_ffffffffffffffa0;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  this = &local_20;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  uVar10 = 0;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  uVar11 = CONCAT13(*pvVar5,(int3)in_stack_ffffffffffffff54);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar11,uVar10),(uint32_t)((ulong)this >> 0x20)
             ,(uint32_t)this,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46);
  Test_Helper::uniformRGBImage(in_stack_ffffffffffffff5f,(Image *)CONCAT44(uVar11,uVar10));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2b5e);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  uVar7 = (undefined2)uVar4;
  uVar8 = (undefined1)(uVar4 >> 0x10);
  uVar9 = (undefined1)(uVar4 >> 0x18);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Unit_Test::fillImage
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = Test_Helper::randomValue<unsigned_char>(0x1d2bb2);
  value = bVar1;
  (*local_8)(local_a8,&local_48,bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,(ulong)bVar1);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(uVar7,uVar4))),value);
  bVar6 = false;
  if (bVar2) {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
                      ((ImageTemplate<unsigned_char> *)local_a8);
    bVar6 = uVar3 == '\x01';
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2c49);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2c56);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar11,uVar10));
  return bVar6;
}

Assistant:

bool form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        const PenguinV_Image::Image output = ExtractChannel( input, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }